

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  ulong *puVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  Split *pSVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  PrimRefVector *ppmVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  Instance *pIVar12;
  PrimRefVector *ppmVar13;
  MemoryMonitorInterface *pMVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint *pvVar26;
  unsigned_long uVar27;
  unsigned_long uVar28;
  BBox1f BVar29;
  char cVar30;
  long lVar31;
  PrimRefMB *pPVar32;
  size_t sVar33;
  undefined8 *puVar34;
  runtime_error *prVar35;
  long lVar36;
  PrimRefVector pmVar37;
  float *pfVar38;
  BBox1f *pBVar39;
  BBox1f BVar40;
  char *pcVar41;
  byte bVar42;
  BuildRecord *in_00;
  PrimInfoMB *pPVar43;
  ulong uVar44;
  code *in_R8;
  PrimInfoMB *leftReduction;
  BBox1f BVar45;
  code *pcVar46;
  ulong uVar47;
  ulong uVar48;
  mvector<PrimRefMB> *prims;
  uint *puVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [16];
  float fVar65;
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  task_group_context *in_stack_ffffffffffffe1d8;
  PrimRefVector local_1e20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1df8;
  undefined1 local_1de8 [8];
  float fStack_1de0;
  float fStack_1ddc;
  SetMB *local_1dd0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1dc8;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  PrimRefVector local_1da8;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1be8;
  BBox1f local_1bd8;
  size_t sStack_1bd0;
  size_t sStack_1bc8;
  BBox1f BStack_1bc0;
  BBox1f local_1bb8;
  BBox1f BStack_1bb0;
  size_t sStack_1ba8;
  size_t sStack_1ba0;
  undefined1 auStack_1b98 [16];
  PrimRefVector local_1b88;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 uStack_1b40;
  ulong local_1b38;
  undefined8 uStack_1b30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1ac8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1aa8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1a98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1a78;
  unsigned_long local_1a68;
  unsigned_long uStack_1a60;
  size_t sStack_1a58;
  size_t sStack_1a50;
  BBox1f local_1a48;
  BBox1f BStack_1a40;
  size_t sStack_1a38;
  size_t sStack_1a30;
  undefined1 auStack_1a28 [16];
  PrimRefVector local_1a18;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  LBBox3fa lbbox;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  PrimRefVector local_1728 [2];
  undefined1 local_1718 [8];
  undefined8 uStack_1710;
  undefined8 local_1708 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_16e8;
  PrimRefVector *local_8c8 [16];
  ulong local_848;
  PrimRefVector local_840;
  PrimRefVector local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar47 = in->depth;
  if ((this->cfg).maxDepth < uVar47) {
    puVar34 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar34 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar34 + 1) = 1;
    puVar34[2] = puVar34 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar34 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar34,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1e08 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.lower.field_0.m128;
  local_1dc8 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0.m128;
  local_1e18 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0.m128;
  _local_1de8 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128;
  uVar5 = *(undefined8 *)
           &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
            lower.field_0;
  uStack_1db0 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.lower.field_0 + 8);
  local_1db8._0_4_ = (uint)uVar5;
  local_1db8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_1b38 = *(ulong *)&(in->prims).super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0;
  uStack_1b30 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.upper.field_0 + 8);
  BVar40 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar45 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  pmVar37 = (in->prims).prims;
  local_1df8._8_8_ = local_1df8._0_8_;
  local_1df8._0_8_ = this;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_16e8 = lbbox.bounds1.upper.field_0;
  local_1708[3] = lbbox.bounds1.lower.field_0._8_8_;
  local_1708[2] = lbbox.bounds1.lower.field_0._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._8_8_ = uStack_1b30;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._0_8_ = local_1b38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[1] = (float)local_1db8._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[0] = (float)(uint)local_1db8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._8_8_ = uStack_1db0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = local_1e08;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = local_1dc8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = local_1dc8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = local_1e18;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = _local_1de8;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar29 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  current.split.dim = lbbox.bounds0.lower.field_0._4_4_;
  current.split.field_2.pos =
       (int)CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_);
  current.split.data = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18);
  local_1708[0] = lbbox.bounds0.upper.field_0._0_8_;
  current.split.mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  current.split.mapping.scale.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)lbbox.bounds1.upper.field_0;
  uVar48 = (long)BVar45 - (long)BVar40;
  if (uVar48 == 0 || uVar47 != 1) {
    bVar42 = 0;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar36 = (long)BVar45 - (long)BVar40;
    if ((ulong)BVar45 < (ulong)BVar40 || lVar36 == 0) {
      auVar52 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar39 = &pmVar37->items[(long)BVar40].time_range;
      auVar52 = ZEXT816(0xff8000007f800000);
      do {
        auVar78._8_8_ = 0;
        auVar78._0_4_ = pBVar39->lower;
        auVar78._4_4_ = pBVar39->upper;
        auVar54 = vcmpps_avx(auVar52,auVar78,1);
        auVar53 = vinsertps_avx(auVar52,auVar78,0x50);
        auVar52 = vblendps_avx(auVar78,auVar52,2);
        auVar52 = vblendvps_avx(auVar52,auVar53,auVar54);
        pBVar39 = pBVar39 + 10;
        lVar36 = lVar36 + -1;
      } while (lVar36 != 0);
    }
    auVar54 = vmovshdup_avx(auVar52);
    auVar54 = vcmpps_avx(auVar54,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                               time_range.upper),1);
    auVar52 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range.
                                       lower),auVar52,1);
    auVar52 = vorps_avx(auVar52,auVar54);
    bVar42 = auVar52[0] & 1;
  }
  current.super_BuildRecord.depth = uVar47;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)BVar40;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)BVar45;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar29;
  current.super_BuildRecord.prims.prims = pmVar37;
  if (((uVar48 <= *(ulong *)(local_1df8._0_8_ + 0x20)) && (current.split.data < 2)) && (bVar42 == 0)
     ) {
    local_1ab8._0_8_ = uVar48 * 0x10;
    pTVar10 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar10->alloc0).end = auVar58._0_8_;
      (pTVar10->alloc0).allocBlockSize = auVar58._8_8_;
      (pTVar10->alloc0).bytesUsed = auVar58._16_8_;
      (pTVar10->alloc0).bytesWasted = auVar58._24_8_;
      (pTVar10->alloc0).ptr = (char *)auVar58._0_8_;
      (pTVar10->alloc0).cur = auVar58._8_8_;
      (pTVar10->alloc0).end = auVar58._16_8_;
      (pTVar10->alloc0).allocBlockSize = auVar58._24_8_;
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).end = auVar58._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar10->alloc1).cur = auVar58._8_8_;
        (pTVar10->alloc1).end = auVar58._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar10->alloc1).cur = auVar58._8_8_;
        (pTVar10->alloc1).end = auVar58._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
        (pTVar10->alloc1).end = auVar58._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar11._M_current = pTVar10;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    local_1e08._0_8_ = alloc.alloc;
    uVar5 = local_1ab8._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1ab8._0_8_;
    sVar33 = (alloc.talloc1)->cur;
    uVar47 = (ulong)(-(int)sVar33 & 0xf);
    uVar44 = sVar33 + local_1ab8._0_8_ + uVar47;
    (alloc.talloc1)->cur = uVar44;
    if ((alloc.talloc1)->end < uVar44) {
      (alloc.talloc1)->cur = sVar33;
      uVar47 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(local_1ab8._0_8_ * 4) < uVar47 || local_1ab8._0_8_ * 4 - uVar47 == 0) {
        lbbox.bounds0.lower.field_0._0_8_ = uVar47;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar41;
        sVar33 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar33;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = uVar5;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)uVar5) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc((FastAllocator *)local_1e08._0_8_,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar41;
          sVar33 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar33;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = uVar5;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)uVar5) {
            (alloc.talloc1)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_013563f4;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar33;
      }
      else {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1ab8);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar47;
      pcVar41 = (alloc.talloc1)->ptr + (uVar44 - local_1ab8._0_8_);
    }
LAB_013563f4:
    uVar47 = 7;
    if (uVar48 < 7) {
      uVar47 = uVar48;
    }
    local_1db8._0_4_ = (uint)(uVar47 | (ulong)pcVar41) | 8;
    local_1db8._4_4_ = (undefined4)((uVar47 | (ulong)pcVar41) >> 0x20);
    if (BVar45 == BVar40) {
      local_1e18.m128[2] = -INFINITY;
      local_1e18._0_8_ = 0xff800000ff800000;
      local_1e18.m128[3] = -INFINITY;
      fStack_1de0 = INFINITY;
      local_1de8 = (undefined1  [8])0x7f8000007f800000;
      fStack_1ddc = INFINITY;
      local_1e08 = _local_1de8;
      local_1dc8 = local_1e18;
    }
    else {
      puVar49 = (uint *)(pcVar41 + 8);
      lVar36 = (long)BVar40 * 0x50 + 0xc;
      local_1e08.m128[2] = INFINITY;
      local_1e08._0_8_ = 0x7f8000007f800000;
      local_1e08.m128[3] = INFINITY;
      local_1dc8.m128[2] = -INFINITY;
      local_1dc8._0_8_ = 0xff800000ff800000;
      local_1dc8.m128[3] = -INFINITY;
      uVar5 = local_1df8._0_8_;
      local_1e18 = local_1dc8;
      _local_1de8 = local_1e08;
      do {
        values[0].ref.ptr._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        values[0].ref.ptr._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        uVar8 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                                 lower.field_0 + lVar36);
        pIVar12 = *(Instance **)
                   (*(long *)(*(long *)(*(long *)(uVar5 + 0x70) + 0x68) + 0x1e8) + (ulong)uVar8 * 8)
        ;
        *(Instance **)(puVar49 + -2) = pIVar12;
        *puVar49 = uVar8;
        Instance::nonlinearBounds
                  (&lbbox,pIVar12,(BBox1f *)values,&(pIVar12->super_Geometry).time_range,
                   (pIVar12->super_Geometry).fnumTimeSegments);
        auVar24[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar24._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar24._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        _local_1de8 = (__m128)vminps_avx(_local_1de8,auVar24);
        local_1e18.m128 = (__m128)vmaxps_avx(local_1e18.m128,lbbox.bounds0.upper.field_0);
        auVar25._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar25._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        local_1e08.m128 = (__m128)vminps_avx(local_1e08.m128,auVar25);
        local_1dc8.m128 = (__m128)vmaxps_avx(local_1dc8.m128,lbbox.bounds1.upper.field_0);
        puVar49 = puVar49 + 4;
        lVar36 = lVar36 + 0x50;
        uVar48 = uVar48 - 1;
      } while (uVar48 != 0);
    }
    (__return_storage_ptr__->ref).ptr = CONCAT44(local_1db8._4_4_,(uint)local_1db8);
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = _local_1de8;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e18;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e08;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dc8;
    __return_storage_ptr__->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return __return_storage_ptr__;
  }
  lVar36 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar36 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar36 + 0xc) = 0;
    lVar36 = lVar36 + 0xf0;
  } while (lVar36 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.upper.field_0 = local_1e08;
  lbbox.bounds1.lower.field_0._0_8_ = local_1dc8._0_8_;
  lbbox.bounds1.lower.field_0._8_8_ = local_1dc8._8_8_;
  lbbox.bounds1.upper.field_0 = local_1e18;
  local_1788 = _local_1de8;
  local_1758[0] = BVar40;
  local_1758[1] = BVar45;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = pmVar37;
  unique0x100037d5 = current.split.field_2.pos;
  local_1718 = lbbox.bounds0.lower.field_0._0_8_;
  unique0x100037d9 = current.split.data;
  local_840 = pmVar37;
  local_838[0] = (PrimRefVector)0x2;
  local_8c8[0] = &local_840;
  local_1de8 = (undefined1  [8])&local_1b78;
  local_1db8 = &local_1a08;
  puVar1 = (ulong *)(local_1df8._0_8_ + 0x48);
  local_1dc8.m128[2] = INFINITY;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1dc8.m128[3] = INFINITY;
  local_1e08.m128[2] = -INFINITY;
  local_1e08._0_8_ = 0xff800000ff800000;
  local_1e08.m128[3] = -INFINITY;
  uVar48 = 0;
  lbbox.bounds0.lower.field_0._0_8_ = uVar47;
  local_1778 = current.super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0;
  local_1768 = current.super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0;
  do {
    leftReduction = &left;
    if (local_848 == 0) goto LAB_01355988;
    uVar47 = 0xffffffffffffffff;
    pBVar39 = local_1758;
    pPVar43 = (PrimInfoMB *)0x0;
    uVar44 = 0;
    do {
      in_R8 = (code *)((long)pBVar39[1] - (long)*pBVar39);
      if (((*(PrimInfoMB **)(local_1df8._0_8_ + 0x20) < in_R8) || (1 < (uint)pBVar39[9].upper)) ||
         (bVar42 != 0)) {
        if (pPVar43 < in_R8) {
          uVar47 = uVar44;
          pPVar43 = (PrimInfoMB *)in_R8;
        }
        bVar42 = 0;
      }
      uVar44 = uVar44 + 1;
      pBVar39 = pBVar39 + 0x1e;
    } while (local_848 != uVar44);
    if (uVar47 == 0xffffffffffffffff) goto LAB_0135593e;
    lVar36 = uVar47 * 0xf0;
    lbbox_1.bounds0.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    local_1b78 = 0xffffffff7f800000;
    uStack_1b70 = 0;
    local_1ab8._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
    local_1a08 = 0xffffffff7f800000;
    uStack_1a00 = 0;
    pSVar4 = (Split *)(local_1718 + lVar36);
    iVar6 = *(int *)((long)local_1708 + lVar36 + -4);
    local_1e18._0_8_ = (long)&lbbox + lVar36;
    local_1b38 = uVar48;
    if (iVar6 == 0) {
      local_1bb8 = local_1758[uVar47 * 0x1e];
      BVar40 = local_1758[uVar47 * 0x1e + 1];
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.max_time_range.lower = 0.0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      auVar72._8_4_ = 0x3f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      auVar72._12_4_ = 0x3f800000;
      uVar5 = vmovlps_avx(auVar72);
      left.max_time_range.upper = (float)uVar5;
      left.time_range.lower = (float)((ulong)uVar5 >> 0x20);
      left.time_range.upper = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      uVar5 = vmovlps_avx(auVar72);
      right.max_time_range.upper = (float)uVar5;
      right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + lVar36 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar31 = (long)(1 << (local_1718[lVar36 + 4] & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar4;
      BStack_1bb0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                      (local_1728[uVar47 * 0x1e]->items,(size_t)local_1bb8,
                                       (size_t)BVar40,(EmptyTy *)local_1ac8,leftReduction,&right,
                                       &isLeft,&reduction,&reduction2,0x80,0xc00);
      local_1b88 = local_1728[uVar47 * 0x1e];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_1728[uVar47 * 0x1e + -1];
      lbbox_1.bounds0.upper.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[0]);
      lbbox_1.bounds0.upper.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[2]);
      lbbox_1.bounds1.lower.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[0]);
      lbbox_1.bounds1.lower.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[2]);
      lbbox_1.bounds1.upper.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[0]);
      lbbox_1.bounds1.upper.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[2]);
      aStack_1be8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1be8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1bd8.upper =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
      local_1bd8.lower =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
      sStack_1bd0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      sStack_1bc8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      BStack_1bc0.upper =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
      BStack_1bc0.lower =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
      sStack_1ba8 = left.num_time_segments;
      sStack_1ba0 = left.max_num_time_segments;
      auStack_1b98._0_8_ = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
      auStack_1b98._8_8_ = SUB168(auStack_1b98,8);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = auStack_1b98._8_8_;
      auVar52 = vcmpps_avx(auVar59,auVar51,1);
      auVar54 = vinsertps_avx(auVar51,auVar59,0x50);
      auVar53 = vinsertps_avx(auVar59,auVar51,0x50);
      auVar52 = vblendvps_avx(auVar53,auVar54,auVar52);
      uVar5 = vmovlps_avx(auVar52);
      auStack_1b98._0_8_ = SUB168(auStack_1b98,0);
      auStack_1b98._8_8_ = uVar5;
      local_1aa8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1aa8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      aStack_1a98.m128[3] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           m128[3];
      aStack_1a98.m128[2] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           m128[2];
      aStack_1a98._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1a88.m128[1] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[1];
      local_1a88.m128[0] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[0];
      local_1a88.m128[3] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[3];
      local_1a88.m128[2] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[2];
      aStack_1a78._0_8_ =
           CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1a78._8_8_ =
           CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1a68 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1a60 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      sStack_1a58 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      sStack_1a50 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      sStack_1a38 = right.num_time_segments;
      sStack_1a30 = right.max_num_time_segments;
      auStack_1a28._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
      auStack_1a28._8_8_ = SUB168(auStack_1a28,8);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auStack_1a28._8_8_;
      auVar52 = vcmpps_avx(auVar60,auVar51,1);
      auVar54 = vinsertps_avx(auVar51,auVar60,0x50);
      auVar53 = vinsertps_avx(auVar60,auVar51,0x50);
      auVar52 = vblendvps_avx(auVar53,auVar54,auVar52);
      uVar5 = vmovlps_avx(auVar52);
      auStack_1a28._0_8_ = SUB168(auStack_1a28,0);
      auStack_1a28._8_8_ = uVar5;
      in_R8 = (code *)leftReduction;
      local_1a48 = BStack_1bb0;
      BStack_1a40 = BVar40;
      local_1a18 = local_1b88;
LAB_01354c62:
      local_1e20 = (PrimRefVector)0x0;
      bVar50 = false;
    }
    else {
      local_1dd0 = (SetMB *)((long)&lbbox + lVar36 + 0x10);
      if (iVar6 != 2) {
        if (iVar6 == 1) {
          SetMB::deterministic_order(local_1dd0);
          splitFallback((BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                         *)local_1df8._0_8_,local_1dd0,(SetMB *)&lbbox_1.bounds0.upper,
                        (SetMB *)&local_1aa8.field_1);
        }
        else if (iVar6 == 3) {
          SetMB::deterministic_order(local_1dd0);
          splitByGeometry((BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                           *)local_1df8._0_8_,local_1dd0,(SetMB *)&lbbox_1.bounds0.upper,
                          (SetMB *)&local_1aa8.field_1);
        }
        goto LAB_01354c62;
      }
      time_range1.lower = *(float *)(local_1718 + lVar36 + 8);
      time_range0.lower = *(float *)(local_1728 + uVar47 * 0x1e + -1);
      time_range1.upper = *(float *)((long)local_1728 + lVar36 + -4);
      local_1da8 = local_1728[uVar47 * 0x1e];
      time_range0.upper = time_range1.lower;
      local_1b88 = (PrimRefVector)operator_new(0x28);
      pMVar14 = (MemoryMonitorInterface *)*puVar1;
      BVar40 = local_1758[uVar47 * 0x1e + 1];
      (local_1b88->alloc).device = pMVar14;
      (local_1b88->alloc).hugepages = false;
      local_1b88->size_active = 0;
      local_1b88->size_alloced = 0;
      local_1b88->items = (PrimRefMB *)0x0;
      sVar33 = (long)BVar40 - (long)local_1758[uVar47 * 0x1e];
      BVar45 = BVar40;
      if (sVar33 != 0) {
        uVar48 = sVar33 * 0x50;
        (**pMVar14->_vptr_MemoryMonitorInterface)(pMVar14,uVar48,0);
        if (uVar48 < 0x1c00000) {
          pPVar32 = (PrimRefMB *)alignedMalloc(uVar48,0x10);
        }
        else {
          pPVar32 = (PrimRefMB *)os_malloc(uVar48,&(local_1b88->alloc).hugepages);
        }
        local_1b88->items = pPVar32;
        local_1b88->size_active = sVar33;
        local_1b88->size_alloced = sVar33;
        BVar40 = *(BBox1f *)(local_1e18._0_8_ + 0x70);
        BVar45 = *(BBox1f *)(local_1e18._0_8_ + 0x78);
      }
      pvVar26 = isLeft.vSplitPos;
      vSplitMask.field_0._0_8_ = local_1da8;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      uVar5 = vmovlps_avx(auVar52);
      right.max_time_range.upper = (float)uVar5;
      right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
      right.time_range.upper = 0.0;
      local_1e20 = local_1b88;
      if ((ulong)((long)BVar45 - (long)BVar40) < 0xc00) {
        isLeft.split = (Split *)BVar40;
        isLeft.vSplitPos = (vint *)BVar45;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar26,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        in_R8 = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)BVar45;
        vSplitPos.field_0.v[1] = (longlong)BVar40;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,in_stack_ffffffffffffe1d8);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar30 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar31 = *(long *)(local_1e18._0_8_ + 0x70);
      pcVar46 = *(code **)(local_1e18._0_8_ + 0x78);
      uVar48 = (long)pcVar46 - lVar31;
      if (left.object_range._end - left.object_range._begin != uVar48) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        in_R8 = (code *)&right;
        left.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (local_1b88->items,0,uVar48,0x400,(anon_class_8_1_41ce32a5 *)in_R8);
        lVar31 = *(long *)(local_1e18._0_8_ + 0x70);
        pcVar46 = *(code **)(local_1e18._0_8_ + 0x78);
        uVar48 = (long)pcVar46 - lVar31;
      }
      uVar5 = vSplitPos.field_0.v[1];
      BStack_1bb0 = (BBox1f)left.object_range._end;
      auVar53._4_4_ = time_range0.upper;
      auVar53._0_4_ = time_range0.lower;
      auVar53._8_8_ = 0;
      lbbox_1.bounds0.upper.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[0]);
      lbbox_1.bounds0.upper.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[2]);
      lbbox_1.bounds1.lower.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[0]);
      lbbox_1.bounds1.lower.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[2]);
      lbbox_1.bounds1.upper.field_0._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[0]);
      lbbox_1.bounds1.upper.field_0._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[2]);
      aStack_1be8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1be8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1bd8.upper =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
      local_1bd8.lower =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
      sStack_1bd0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      sStack_1bc8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      BStack_1bc0.upper =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
      BStack_1bc0.lower =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
      sStack_1ba8 = left.num_time_segments;
      sStack_1ba0 = left.max_num_time_segments;
      local_1bb8.lower = (float)(undefined4)left.object_range._begin;
      local_1bb8.upper = (float)left.object_range._begin._4_4_;
      auVar61._4_4_ = left.max_time_range.upper;
      auVar61._0_4_ = left.max_time_range.lower;
      auVar61._8_8_ = 0;
      auVar66._4_4_ = left.time_range.upper;
      auVar66._0_4_ = left.time_range.lower;
      auVar66._8_8_ = 0;
      auVar52 = vcmpps_avx(auVar66,auVar53,1);
      auVar54 = vinsertps_avx(auVar53,auVar66,0x50);
      auVar53 = vinsertps_avx(auVar66,auVar53,0x50);
      auVar52 = vblendvps_avx(auVar53,auVar54,auVar52);
      auStack_1b98 = vmovlhps_avx(auVar61,auVar52);
      _reduction2 = local_1da8;
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      vmovlps_avx(auVar54);
      if (uVar48 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar31;
        vSplitPos.field_0.v[1] = (longlong)pcVar46;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar5,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        in_R8 = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1ac8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1ac8._8_8_ = &reduction2;
        _reduction = pcVar46;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1ac8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,in_stack_ffffffffffffe1d8);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar30 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar31 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e18._0_8_ + 0x70);
      right.object_range._end = lVar31 + right.object_range._begin;
      if (lVar31 != *(unsigned_long *)(local_1e18._0_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        in_R8 = (code *)&isLeft;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (local_1da8->items,right.object_range._begin,
                        *(unsigned_long *)(local_1e18._0_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)in_R8);
      }
      auVar55._4_4_ = time_range1.upper;
      auVar55._0_4_ = time_range1.lower;
      auVar55._8_8_ = 0;
      aStack_1a98.m128[3] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           m128[3];
      aStack_1a98.m128[2] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           m128[2];
      local_1a88.m128[1] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[1];
      local_1a88.m128[0] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[0];
      local_1a88.m128[3] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[3];
      local_1a88.m128[2] =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           m128[2];
      aStack_1a78._0_8_ =
           CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1a78._8_8_ =
           CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1a68 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1a60 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      sStack_1a58 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      sStack_1a50 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      sStack_1a38 = right.num_time_segments;
      sStack_1a30 = right.max_num_time_segments;
      local_1aa8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1aa8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      aStack_1a98._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      auVar62._4_4_ = right.max_time_range.upper;
      auVar62._0_4_ = right.max_time_range.lower;
      auVar62._8_8_ = 0;
      auVar67._4_4_ = right.time_range.upper;
      auVar67._0_4_ = right.time_range.lower;
      auVar67._8_8_ = 0;
      auVar52 = vcmpps_avx(auVar67,auVar55,1);
      auVar54 = vinsertps_avx(auVar55,auVar67,0x50);
      auVar53 = vinsertps_avx(auVar67,auVar55,0x50);
      auVar52 = vblendvps_avx(auVar53,auVar54,auVar52);
      auStack_1a28 = vmovlhps_avx(auVar62,auVar52);
      local_1a18 = local_1da8;
      bVar50 = local_1e20 != (PrimRefVector)0x0;
      local_1a48 = (BBox1f)right.object_range._begin;
      BStack_1a40 = (BBox1f)right.object_range._end;
    }
    uVar5 = local_1df8._0_8_;
    findFallback((Split *)&left,
                 (BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                  *)local_1df8._0_8_,(SetMB *)&lbbox_1.bounds0.upper);
    *(ulong *)local_1de8 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[0]);
    *(ulong *)((long)local_1de8 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[2]);
    local_1b68 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[0]);
    local_1b58 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[0]);
    uStack_1b50 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[2]);
    uStack_1b48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[1],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[0]);
    uStack_1b40 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[2]);
    findFallback((Split *)&left,
                 (BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                  *)uVar5,(SetMB *)&local_1aa8.field_1);
    lVar31 = local_640;
    *local_1db8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0.m128[1],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0.m128[0]);
    local_1db8[1] =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[2]);
    local_19f8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[0]);
    local_19e8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[0]);
    uStack_19e0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[2]);
    uStack_19d8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[1],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[0]);
    uStack_19d0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[2]);
    local_1e20 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  *)0x0;
    ppmVar9 = local_8c8[uVar47];
    if (local_1b88 == *ppmVar9) {
      ppmVar9[1] = (PrimRefVector)((long)&(ppmVar9[1]->alloc).device + 1);
      pmVar37 = local_1b88;
    }
    else {
      local_640 = local_640 + 1;
      local_838[lVar31 * 2 + -1] = local_1b88;
      local_838[lVar31 * 2] = (PrimRefVector)0x1;
      local_8c8[uVar47] = local_838 + lVar31 * 2 + -1;
      pmVar37 = *ppmVar9;
    }
    lVar31 = local_640;
    if (local_1a18 == pmVar37) {
      local_8c8[local_848] = ppmVar9;
      pmVar37 = ppmVar9[1];
      ppmVar9[1] = (PrimRefVector)((long)&(pmVar37->alloc).device + 1);
    }
    else {
      local_640 = local_640 + 1;
      local_838[lVar31 * 2 + -1] = local_1a18;
      local_838[lVar31 * 2] = (PrimRefVector)0x1;
      local_8c8[local_848] = local_838 + lVar31 * 2 + -1;
      pmVar37 = (PrimRefVector)((long)&ppmVar9[1][-1].items + 7);
    }
    ppmVar9[1] = pmVar37;
    if (pmVar37 == (PrimRefVector)0x0) {
      pmVar37 = *ppmVar9;
      if (pmVar37 != (PrimRefVector)0x0) {
        sVar33 = pmVar37->size_alloced;
        pPVar32 = pmVar37->items;
        if (pPVar32 != (PrimRefMB *)0x0) {
          if (sVar33 * 0x50 < 0x1c00000) {
            alignedFree(pPVar32);
          }
          else {
            os_free(pPVar32,sVar33 * 0x50,(pmVar37->alloc).hugepages);
          }
        }
        if (sVar33 != 0) {
          pMVar14 = (pmVar37->alloc).device;
          (**pMVar14->_vptr_MemoryMonitorInterface)(pMVar14,sVar33 * -0x50,1);
        }
        pmVar37->size_active = 0;
        pmVar37->size_alloced = 0;
        pmVar37->items = (PrimRefMB *)0x0;
      }
      operator_delete(pmVar37);
    }
    auVar52 = auStack_1a28;
    *(undefined8 *)local_1e18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x40) = aStack_1be8._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x48) = aStack_1be8._8_8_;
    *(BBox1f *)(local_1e18._0_8_ + 0x50) = local_1bd8;
    *(size_t *)(local_1e18._0_8_ + 0x58) = sStack_1bd0;
    *(size_t *)(local_1e18._0_8_ + 0x60) = sStack_1bc8;
    *(BBox1f *)(local_1e18._0_8_ + 0x68) = BStack_1bc0;
    *(BBox1f *)(local_1e18._0_8_ + 0x70) = local_1bb8;
    *(BBox1f *)(local_1e18._0_8_ + 0x78) = BStack_1bb0;
    *(size_t *)(local_1e18._0_8_ + 0x80) = sStack_1ba8;
    *(size_t *)(local_1e18._0_8_ + 0x88) = sStack_1ba0;
    *(undefined8 *)(local_1e18._0_8_ + 0x90) = auStack_1b98._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x98) = auStack_1b98._8_8_;
    *(PrimRefVector *)(local_1e18._0_8_ + 0xa0) = local_1b88;
    uVar5 = *(undefined8 *)local_1de8;
    uVar15 = *(undefined8 *)((long)local_1de8 + 8);
    pSVar4->sah = (float)(int)uVar5;
    pSVar4->dim = (int)((ulong)uVar5 >> 0x20);
    *(undefined8 *)(local_1718 + lVar36 + 8) = uVar15;
    uVar47 = local_848;
    *(undefined8 *)(local_1e18._0_8_ + 0xc0) = local_1b68;
    *(undefined8 *)(local_1e18._0_8_ + 0xd0) = local_1b58;
    *(undefined8 *)(local_1e18._0_8_ + 0xd8) = uStack_1b50;
    *(undefined8 *)(local_1e18._0_8_ + 0xe0) = uStack_1b48;
    *(undefined8 *)(local_1e18._0_8_ + 0xe8) = uStack_1b40;
    lVar36 = local_848 * 0xf0;
    *(undefined8 *)((long)&lbbox + lVar36) = local_1ab8._0_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x10) = local_1aa8._0_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x18) = local_1aa8._8_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x20) = aStack_1a98._0_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x28) = aStack_1a98._8_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x30) = local_1a88._0_8_;
    *(undefined8 *)((long)&lbbox + lVar36 + 0x38) = local_1a88._8_8_;
    *(undefined8 *)(&local_1788 + uVar47 * 0xf) = aStack_1a78._0_8_;
    *(undefined8 *)((long)&local_1788 + lVar36 + 8) = aStack_1a78._8_8_;
    *(unsigned_long *)((long)&local_1778 + uVar47 * 0xf0) = local_1a68;
    *(unsigned_long *)((long)&local_1778 + uVar47 * 0xf0 + 8) = uStack_1a60;
    *(size_t *)(&local_1768 + uVar47 * 0xf) = sStack_1a58;
    *(size_t *)((long)&local_1768 + lVar36 + 8) = sStack_1a50;
    local_1758[uVar47 * 0x1e] = local_1a48;
    local_1758[uVar47 * 0x1e + 1] = BStack_1a40;
    asStack_1748[uVar47 * 0x1e] = sStack_1a38;
    asStack_1748[uVar47 * 0x1e + 1] = sStack_1a30;
    (&local_1738)[uVar47 * 0x1e].lower = (float)auStack_1a28._0_4_;
    (&local_1738)[uVar47 * 0x1e].upper = (float)auStack_1a28._4_4_;
    local_1728[uVar47 * 0x1e + -1] = (PrimRefVector)auStack_1a28._8_8_;
    local_1728[uVar47 * 0x1e] = local_1a18;
    uVar5 = local_1db8[1];
    *(undefined8 *)(local_1718 + lVar36) = *local_1db8;
    *(undefined8 *)(local_1718 + lVar36 + 8) = uVar5;
    local_1708[uVar47 * 0x1e] = local_19f8;
    local_1708[uVar47 * 0x1e + 2] = local_19e8;
    *(undefined8 *)((long)&local_16e8.field_1 + (uVar47 * 0xf + -1) * 0x10 + 8) = uStack_19e0;
    *(undefined8 *)(&local_16e8 + uVar47 * 0xf) = uStack_19d8;
    *(undefined8 *)((long)&local_16e8 + uVar47 * 0xf0 + 8) = uStack_19d0;
    local_848 = local_848 + 1;
    auStack_1a28 = auVar52;
    if (local_1e20 !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)&local_1e20,local_1e20);
    }
    uVar48 = CONCAT71((int7)(local_1b38 >> 8),(byte)local_1b38 | bVar50);
  } while (local_848 < *(ulong *)local_1df8._0_8_);
  if (local_848 != 0) {
LAB_0135593e:
    pfVar38 = &fStack_172c;
    uVar47 = local_848;
    do {
      auVar52 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416((uint)pfVar38[-1]),1);
      auVar54 = vcmpps_avx(ZEXT416((uint)*pfVar38),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar52 = vorps_avx(auVar52,auVar54);
      uVar48 = (ulong)(byte)((byte)uVar48 | auVar52[0]);
      pfVar38 = pfVar38 + 0x3c;
      uVar47 = uVar47 - 1;
    } while (uVar47 != 0);
  }
LAB_01355988:
  if ((uVar48 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      local_1ab8._8_1_ = 1;
      local_1ab8._0_8_ = pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar10->alloc0).end = auVar58._0_8_;
      (pTVar10->alloc0).allocBlockSize = auVar58._8_8_;
      (pTVar10->alloc0).bytesUsed = auVar58._16_8_;
      (pTVar10->alloc0).bytesWasted = auVar58._24_8_;
      (pTVar10->alloc0).ptr = (char *)auVar58._0_8_;
      (pTVar10->alloc0).cur = auVar58._8_8_;
      (pTVar10->alloc0).end = auVar58._16_8_;
      (pTVar10->alloc0).allocBlockSize = auVar58._24_8_;
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).end = auVar58._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar10->alloc1).cur = auVar58._8_8_;
        (pTVar10->alloc1).end = auVar58._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar10->alloc1).cur = auVar58._8_8_;
        (pTVar10->alloc1).end = auVar58._16_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
        (pTVar10->alloc1).end = auVar58._0_8_;
        (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
           SUB84(pTVar10,0);
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
           (float)((ulong)pTVar10 >> 0x20);
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&left);
      }
      else {
        *iVar11._M_current =
             (ThreadLocal2 *)
             CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[1],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[0]);
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (local_1ab8._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1ab8._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar33 = (alloc.talloc0)->cur;
    uVar47 = (ulong)(-(int)sVar33 & 0xf);
    uVar48 = sVar33 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar47;
    (alloc.talloc0)->cur = uVar48;
    if ((alloc.talloc0)->end < uVar48) {
      (alloc.talloc0)->cur = sVar33;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar41;
        sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar33;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar41;
          sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar33;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_01355d1f;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar33;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar47;
      pcVar41 = (alloc.talloc0)->ptr +
                (uVar48 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_01355d1f:
    uVar48 = 1;
    uVar47 = 0;
    puVar34 = local_1db8;
    goto LAB_01355d28;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    local_1ab8._8_1_ = 1;
    local_1ab8._0_8_ = pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar10->alloc0).end = auVar58._0_8_;
    (pTVar10->alloc0).allocBlockSize = auVar58._8_8_;
    (pTVar10->alloc0).bytesUsed = auVar58._16_8_;
    (pTVar10->alloc0).bytesWasted = auVar58._24_8_;
    (pTVar10->alloc0).ptr = (char *)auVar58._0_8_;
    (pTVar10->alloc0).cur = auVar58._8_8_;
    (pTVar10->alloc0).end = auVar58._16_8_;
    (pTVar10->alloc0).allocBlockSize = auVar58._24_8_;
    auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).end = auVar58._0_8_;
      (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
      (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
      (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
      (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
      (pTVar10->alloc1).cur = auVar58._8_8_;
      (pTVar10->alloc1).end = auVar58._16_8_;
      (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)auVar58._0_8_;
      (pTVar10->alloc1).cur = auVar58._8_8_;
      (pTVar10->alloc1).end = auVar58._16_8_;
      (pTVar10->alloc1).allocBlockSize = auVar58._24_8_;
      (pTVar10->alloc1).end = auVar58._0_8_;
      (pTVar10->alloc1).allocBlockSize = auVar58._8_8_;
      (pTVar10->alloc1).bytesUsed = auVar58._16_8_;
      (pTVar10->alloc1).bytesWasted = auVar58._24_8_;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
         SUB84(pTVar10,0);
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
         (float)((ulong)pTVar10 >> 0x20);
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&left);
    }
    else {
      *iVar11._M_current =
           (ThreadLocal2 *)
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0.m128[0]);
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_1ab8._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1ab8._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar33 = (alloc.talloc0)->cur;
  uVar47 = (ulong)(-(int)sVar33 & 0xf);
  uVar48 = sVar33 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar47;
  (alloc.talloc0)->cur = uVar48;
  if ((alloc.talloc0)->end < uVar48) {
    (alloc.talloc0)->cur = sVar33;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar41;
      sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar33;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar41;
        sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar33;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar41 = (char *)0x0;
          goto LAB_01355c84;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar33;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar47;
    pcVar41 = (alloc.talloc0)->ptr +
              (uVar48 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_01355c84:
  pcVar41[0xe0] = '\0';
  pcVar41[0xe1] = '\0';
  pcVar41[0xe2] = -0x80;
  pcVar41[0xe3] = '\x7f';
  pcVar41[0xe4] = '\0';
  pcVar41[0xe5] = '\0';
  pcVar41[0xe6] = -0x80;
  pcVar41[0xe7] = '\x7f';
  pcVar41[0xe8] = '\0';
  pcVar41[0xe9] = '\0';
  pcVar41[0xea] = -0x80;
  pcVar41[0xeb] = '\x7f';
  pcVar41[0xec] = '\0';
  pcVar41[0xed] = '\0';
  pcVar41[0xee] = -0x80;
  pcVar41[0xef] = '\x7f';
  pcVar41[0xf0] = '\0';
  pcVar41[0xf1] = '\0';
  pcVar41[0xf2] = -0x80;
  pcVar41[0xf3] = -1;
  pcVar41[0xf4] = '\0';
  pcVar41[0xf5] = '\0';
  pcVar41[0xf6] = -0x80;
  pcVar41[0xf7] = -1;
  pcVar41[0xf8] = '\0';
  pcVar41[0xf9] = '\0';
  pcVar41[0xfa] = -0x80;
  pcVar41[0xfb] = -1;
  pcVar41[0xfc] = '\0';
  pcVar41[0xfd] = '\0';
  pcVar41[0xfe] = -0x80;
  pcVar41[0xff] = -1;
  uVar47 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
  uVar48 = 6;
  puVar34 = local_1db8;
LAB_01355d28:
  local_1db8._4_4_ = (undefined4)((ulong)puVar34 >> 0x20);
  pcVar41[0x60] = '\0';
  pcVar41[0x61] = '\0';
  pcVar41[0x62] = -0x80;
  pcVar41[99] = '\x7f';
  pcVar41[100] = '\0';
  pcVar41[0x65] = '\0';
  pcVar41[0x66] = -0x80;
  pcVar41[0x67] = '\x7f';
  pcVar41[0x68] = '\0';
  pcVar41[0x69] = '\0';
  pcVar41[0x6a] = -0x80;
  pcVar41[0x6b] = '\x7f';
  pcVar41[0x6c] = '\0';
  pcVar41[0x6d] = '\0';
  pcVar41[0x6e] = -0x80;
  pcVar41[0x6f] = '\x7f';
  pcVar41[0x40] = '\0';
  pcVar41[0x41] = '\0';
  pcVar41[0x42] = -0x80;
  pcVar41[0x43] = '\x7f';
  pcVar41[0x44] = '\0';
  pcVar41[0x45] = '\0';
  pcVar41[0x46] = -0x80;
  pcVar41[0x47] = '\x7f';
  pcVar41[0x48] = '\0';
  pcVar41[0x49] = '\0';
  pcVar41[0x4a] = -0x80;
  pcVar41[0x4b] = '\x7f';
  pcVar41[0x4c] = '\0';
  pcVar41[0x4d] = '\0';
  pcVar41[0x4e] = -0x80;
  pcVar41[0x4f] = '\x7f';
  pcVar41[0x20] = '\0';
  pcVar41[0x21] = '\0';
  pcVar41[0x22] = -0x80;
  pcVar41[0x23] = '\x7f';
  pcVar41[0x24] = '\0';
  pcVar41[0x25] = '\0';
  pcVar41[0x26] = -0x80;
  pcVar41[0x27] = '\x7f';
  pcVar41[0x28] = '\0';
  pcVar41[0x29] = '\0';
  pcVar41[0x2a] = -0x80;
  pcVar41[0x2b] = '\x7f';
  pcVar41[0x2c] = '\0';
  pcVar41[0x2d] = '\0';
  pcVar41[0x2e] = -0x80;
  pcVar41[0x2f] = '\x7f';
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  auVar52 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar41 + 0x80) = ZEXT1632(auVar52);
  *(undefined1 (*) [32])(pcVar41 + 0xa0) = ZEXT1632(auVar52);
  *(undefined1 (*) [32])(pcVar41 + 0xc0) = ZEXT1632(auVar52);
  pcVar41[0] = '\b';
  pcVar41[1] = '\0';
  pcVar41[2] = '\0';
  pcVar41[3] = '\0';
  pcVar41[4] = '\0';
  pcVar41[5] = '\0';
  pcVar41[6] = '\0';
  pcVar41[7] = '\0';
  pcVar41[8] = '\b';
  pcVar41[9] = '\0';
  pcVar41[10] = '\0';
  pcVar41[0xb] = '\0';
  pcVar41[0xc] = '\0';
  pcVar41[0xd] = '\0';
  pcVar41[0xe] = '\0';
  pcVar41[0xf] = '\0';
  pcVar41[0x10] = '\b';
  pcVar41[0x11] = '\0';
  pcVar41[0x12] = '\0';
  pcVar41[0x13] = '\0';
  pcVar41[0x14] = '\0';
  pcVar41[0x15] = '\0';
  pcVar41[0x16] = '\0';
  pcVar41[0x17] = '\0';
  pcVar41[0x18] = '\b';
  pcVar41[0x19] = '\0';
  pcVar41[0x1a] = '\0';
  pcVar41[0x1b] = '\0';
  pcVar41[0x1c] = '\0';
  pcVar41[0x1d] = '\0';
  pcVar41[0x1e] = '\0';
  pcVar41[0x1f] = '\0';
  local_1e18.m128[2] = -INFINITY;
  local_1e18._0_8_ = 0xff800000ff800000;
  local_1e18.m128[3] = -INFINITY;
  fVar65 = INFINITY;
  fVar71 = INFINITY;
  fVar79 = INFINITY;
  fVar85 = INFINITY;
  if (local_848 != 0) {
    local_1db8._0_4_ = (uint)uVar47;
    pBVar39 = &values[0].dt;
    uVar47 = 0;
    local_1dc8.m128[2] = INFINITY;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1dc8.m128[3] = INFINITY;
    fStack_1de0 = INFINITY;
    local_1de8 = (undefined1  [8])0x7f8000007f800000;
    fStack_1ddc = INFINITY;
    local_1e08.m128[2] = -INFINITY;
    local_1e08._0_8_ = 0xff800000ff800000;
    local_1e08.m128[3] = -INFINITY;
    local_1e18.m128[2] = -INFINITY;
    local_1e18._0_8_ = 0xff800000ff800000;
    local_1e18.m128[3] = -INFINITY;
    in_00 = (BuildRecord *)&lbbox;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,
                      (BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                       *)local_1df8._0_8_,in_00,alloc);
      puVar34 = (undefined8 *)CONCAT44(local_1db8._4_4_,(uint)local_1db8);
      pBVar39[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar39[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar17._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar17._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar39 + -8) = auVar17;
      auVar19._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
      auVar19._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar39 + -6) = auVar19;
      auVar21._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
      auVar21._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar39 + -4) = auVar21;
      auVar23._8_8_ = aStack_1be8._8_8_;
      auVar23._0_8_ = aStack_1be8._0_8_;
      *(undefined1 (*) [16])(pBVar39 + -2) = auVar23;
      *pBVar39 = local_1bd8;
      local_1dc8.m128 = (__m128)vminps_avx(local_1dc8.m128,auVar17);
      local_1e08.m128 = (__m128)vmaxps_avx(local_1e08.m128,auVar19);
      _local_1de8 = (__m128)vminps_avx(_local_1de8,auVar21);
      local_1e18.m128 = (__m128)vmaxps_avx(local_1e18.m128,auVar23);
      uVar47 = uVar47 + 1;
      pBVar39 = pBVar39 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar47 < local_848);
    if (((uint)uVar48 | (uint)pcVar41 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar44 = (ulong)pcVar41 & 0xfffffffffffffff0;
        pfVar38 = &values[0].dt.upper;
        uVar47 = 0;
        auVar68._8_4_ = 0x7f7fffff;
        auVar68._0_8_ = 0x7f7fffff7f7fffff;
        auVar68._12_4_ = 0x7f7fffff;
        auVar73._8_4_ = 0xff7fffff;
        auVar73._0_8_ = 0xff7fffffff7fffff;
        auVar73._12_4_ = 0xff7fffff;
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        do {
          *(undefined8 *)(uVar44 + uVar47 * 8) = *(undefined8 *)(pfVar38 + -0x15);
          fVar65 = ((BBox1f *)(pfVar38 + -1))->lower;
          fVar79 = 1.0 / (*pfVar38 - fVar65);
          fVar71 = -fVar65 * fVar79;
          auVar52 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
          auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar71)),ZEXT416((uint)(1.0 - fVar71)),0);
          auVar96._0_4_ = pfVar38[-9] * auVar52._0_4_ + pfVar38[-0x11] * auVar54._0_4_;
          auVar96._4_4_ = pfVar38[-8] * auVar52._4_4_ + pfVar38[-0x10] * auVar54._4_4_;
          auVar96._8_4_ = pfVar38[-7] * auVar52._8_4_ + pfVar38[-0xf] * auVar54._8_4_;
          auVar96._12_4_ = pfVar38[-6] * auVar52._12_4_ + pfVar38[-0xe] * auVar54._12_4_;
          auVar83._0_4_ = pfVar38[-5] * auVar52._0_4_ + pfVar38[-0xd] * auVar54._0_4_;
          auVar83._4_4_ = pfVar38[-4] * auVar52._4_4_ + pfVar38[-0xc] * auVar54._4_4_;
          auVar83._8_4_ = pfVar38[-3] * auVar52._8_4_ + pfVar38[-0xb] * auVar54._8_4_;
          auVar83._12_4_ = pfVar38[-2] * auVar52._12_4_ + pfVar38[-10] * auVar54._12_4_;
          fVar79 = (1.0 - fVar65) * fVar79;
          auVar52 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
          auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
          auVar86._0_4_ = pfVar38[-9] * auVar52._0_4_ + pfVar38[-0x11] * auVar54._0_4_;
          auVar86._4_4_ = pfVar38[-8] * auVar52._4_4_ + pfVar38[-0x10] * auVar54._4_4_;
          auVar86._8_4_ = pfVar38[-7] * auVar52._8_4_ + pfVar38[-0xf] * auVar54._8_4_;
          auVar86._12_4_ = pfVar38[-6] * auVar52._12_4_ + pfVar38[-0xe] * auVar54._12_4_;
          auVar80._0_4_ = pfVar38[-5] * auVar52._0_4_ + pfVar38[-0xd] * auVar54._0_4_;
          auVar80._4_4_ = pfVar38[-4] * auVar52._4_4_ + pfVar38[-0xc] * auVar54._4_4_;
          auVar80._8_4_ = pfVar38[-3] * auVar52._8_4_ + pfVar38[-0xb] * auVar54._8_4_;
          auVar80._12_4_ = pfVar38[-2] * auVar52._12_4_ + pfVar38[-10] * auVar54._12_4_;
          auVar78 = vminps_avx(auVar96,auVar68);
          auVar54 = vmaxps_avx(auVar83,auVar73);
          auVar61 = vminps_avx(auVar86,auVar68);
          auVar53 = vmaxps_avx(auVar80,auVar73);
          auVar52 = vandps_avx(auVar78,auVar76);
          auVar89._0_4_ = auVar52._0_4_ * 4.7683716e-07;
          auVar89._4_4_ = auVar52._4_4_ * 4.7683716e-07;
          auVar89._8_4_ = auVar52._8_4_ * 4.7683716e-07;
          auVar89._12_4_ = auVar52._12_4_ * 4.7683716e-07;
          auVar78 = vsubps_avx(auVar78,auVar89);
          auVar52 = vandps_avx(auVar54,auVar76);
          auVar84._0_4_ = auVar54._0_4_ + auVar52._0_4_ * 4.7683716e-07;
          auVar84._4_4_ = auVar54._4_4_ + auVar52._4_4_ * 4.7683716e-07;
          auVar84._8_4_ = auVar54._8_4_ + auVar52._8_4_ * 4.7683716e-07;
          auVar84._12_4_ = auVar54._12_4_ + auVar52._12_4_ * 4.7683716e-07;
          auVar52 = vandps_avx(auVar61,auVar76);
          auVar90._0_4_ = auVar52._0_4_ * 4.7683716e-07;
          auVar90._4_4_ = auVar52._4_4_ * 4.7683716e-07;
          auVar90._8_4_ = auVar52._8_4_ * 4.7683716e-07;
          auVar90._12_4_ = auVar52._12_4_ * 4.7683716e-07;
          auVar54 = vsubps_avx(auVar61,auVar90);
          auVar52 = vandps_avx(auVar53,auVar76);
          *(int *)(uVar44 + 0x20 + uVar47 * 4) = auVar78._0_4_;
          uVar7 = vextractps_avx(auVar78,1);
          *(undefined4 *)(uVar44 + 0x40 + uVar47 * 4) = uVar7;
          auVar81._0_4_ = auVar52._0_4_ * 4.7683716e-07 + auVar53._0_4_;
          auVar81._4_4_ = auVar52._4_4_ * 4.7683716e-07 + auVar53._4_4_;
          auVar81._8_4_ = auVar52._8_4_ * 4.7683716e-07 + auVar53._8_4_;
          auVar81._12_4_ = auVar52._12_4_ * 4.7683716e-07 + auVar53._12_4_;
          uVar7 = vextractps_avx(auVar78,2);
          *(undefined4 *)(uVar44 + 0x60 + uVar47 * 4) = uVar7;
          *(float *)(uVar44 + 0x30 + uVar47 * 4) = auVar84._0_4_;
          uVar7 = vextractps_avx(auVar84,1);
          *(undefined4 *)(uVar44 + 0x50 + uVar47 * 4) = uVar7;
          auVar52 = vsubps_avx(auVar54,auVar78);
          uVar7 = vextractps_avx(auVar84,2);
          *(undefined4 *)(uVar44 + 0x70 + uVar47 * 4) = uVar7;
          *(int *)(uVar44 + 0x80 + uVar47 * 4) = auVar52._0_4_;
          uVar7 = vextractps_avx(auVar52,1);
          *(undefined4 *)(uVar44 + 0xa0 + uVar47 * 4) = uVar7;
          auVar54 = vsubps_avx(auVar81,auVar84);
          uVar7 = vextractps_avx(auVar52,2);
          *(undefined4 *)(uVar44 + 0xc0 + uVar47 * 4) = uVar7;
          *(int *)(uVar44 + 0x90 + uVar47 * 4) = auVar54._0_4_;
          uVar7 = vextractps_avx(auVar54,1);
          *(undefined4 *)(uVar44 + 0xb0 + uVar47 * 4) = uVar7;
          uVar7 = vextractps_avx(auVar54,2);
          *(undefined4 *)(uVar44 + 0xd0 + uVar47 * 4) = uVar7;
          uVar47 = uVar47 + 1;
          pfVar38 = pfVar38 + 0x18;
        } while (local_848 != uVar47);
      }
    }
    else if (local_848 != 0) {
      uVar44 = (ulong)pcVar41 & 0xfffffffffffffff0;
      pfVar38 = &values[0].dt.upper;
      uVar47 = 0;
      auVar70._8_4_ = 0x7f7fffff;
      auVar70._0_8_ = 0x7f7fffff7f7fffff;
      auVar70._12_4_ = 0x7f7fffff;
      auVar75._8_4_ = 0xff7fffff;
      auVar75._0_8_ = 0xff7fffffff7fffff;
      auVar75._12_4_ = 0xff7fffff;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      auVar82._8_4_ = 0x3f800001;
      auVar82._0_8_ = 0x3f8000013f800001;
      auVar82._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar44 + uVar47 * 8) = *(undefined8 *)(pfVar38 + -0x15);
        fVar65 = *pfVar38;
        fVar71 = ((BBox1f *)(pfVar38 + -1))->lower;
        fVar85 = 1.0 / (fVar65 - fVar71);
        fVar79 = fVar85 * -fVar71;
        auVar52 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
        auVar64._0_4_ = pfVar38[-9] * auVar52._0_4_ + pfVar38[-0x11] * auVar54._0_4_;
        auVar64._4_4_ = pfVar38[-8] * auVar52._4_4_ + pfVar38[-0x10] * auVar54._4_4_;
        auVar64._8_4_ = pfVar38[-7] * auVar52._8_4_ + pfVar38[-0xf] * auVar54._8_4_;
        auVar64._12_4_ = pfVar38[-6] * auVar52._12_4_ + pfVar38[-0xe] * auVar54._12_4_;
        auVar91._0_4_ = pfVar38[-5] * auVar52._0_4_ + pfVar38[-0xd] * auVar54._0_4_;
        auVar91._4_4_ = pfVar38[-4] * auVar52._4_4_ + pfVar38[-0xc] * auVar54._4_4_;
        auVar91._8_4_ = pfVar38[-3] * auVar52._8_4_ + pfVar38[-0xb] * auVar54._8_4_;
        auVar91._12_4_ = pfVar38[-2] * auVar52._12_4_ + pfVar38[-10] * auVar54._12_4_;
        fVar85 = (1.0 - fVar71) * fVar85;
        auVar52 = vshufps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar85)),ZEXT416((uint)(1.0 - fVar85)),0);
        auVar93._0_4_ = pfVar38[-9] * auVar52._0_4_ + pfVar38[-0x11] * auVar54._0_4_;
        auVar93._4_4_ = pfVar38[-8] * auVar52._4_4_ + pfVar38[-0x10] * auVar54._4_4_;
        auVar93._8_4_ = pfVar38[-7] * auVar52._8_4_ + pfVar38[-0xf] * auVar54._8_4_;
        auVar93._12_4_ = pfVar38[-6] * auVar52._12_4_ + pfVar38[-0xe] * auVar54._12_4_;
        auVar87._0_4_ = pfVar38[-5] * auVar52._0_4_ + pfVar38[-0xd] * auVar54._0_4_;
        auVar87._4_4_ = pfVar38[-4] * auVar52._4_4_ + pfVar38[-0xc] * auVar54._4_4_;
        auVar87._8_4_ = pfVar38[-3] * auVar52._8_4_ + pfVar38[-0xb] * auVar54._8_4_;
        auVar87._12_4_ = pfVar38[-2] * auVar52._12_4_ + pfVar38[-10] * auVar54._12_4_;
        auVar78 = vminps_avx(auVar64,auVar70);
        auVar54 = vmaxps_avx(auVar91,auVar75);
        auVar61 = vminps_avx(auVar93,auVar70);
        auVar53 = vmaxps_avx(auVar87,auVar75);
        auVar52 = vandps_avx(auVar78,auVar77);
        auVar94._0_4_ = auVar52._0_4_ * 4.7683716e-07;
        auVar94._4_4_ = auVar52._4_4_ * 4.7683716e-07;
        auVar94._8_4_ = auVar52._8_4_ * 4.7683716e-07;
        auVar94._12_4_ = auVar52._12_4_ * 4.7683716e-07;
        auVar78 = vsubps_avx(auVar78,auVar94);
        auVar52 = vandps_avx(auVar54,auVar77);
        auVar92._0_4_ = auVar54._0_4_ + auVar52._0_4_ * 4.7683716e-07;
        auVar92._4_4_ = auVar54._4_4_ + auVar52._4_4_ * 4.7683716e-07;
        auVar92._8_4_ = auVar54._8_4_ + auVar52._8_4_ * 4.7683716e-07;
        auVar92._12_4_ = auVar54._12_4_ + auVar52._12_4_ * 4.7683716e-07;
        auVar52 = vandps_avx(auVar61,auVar77);
        auVar95._0_4_ = auVar52._0_4_ * 4.7683716e-07;
        auVar95._4_4_ = auVar52._4_4_ * 4.7683716e-07;
        auVar95._8_4_ = auVar52._8_4_ * 4.7683716e-07;
        auVar95._12_4_ = auVar52._12_4_ * 4.7683716e-07;
        auVar54 = vsubps_avx(auVar61,auVar95);
        auVar52 = vandps_avx(auVar53,auVar77);
        *(int *)(uVar44 + 0x20 + uVar47 * 4) = auVar78._0_4_;
        uVar7 = vextractps_avx(auVar78,1);
        *(undefined4 *)(uVar44 + 0x40 + uVar47 * 4) = uVar7;
        auVar88._0_4_ = auVar53._0_4_ + auVar52._0_4_ * 4.7683716e-07;
        auVar88._4_4_ = auVar53._4_4_ + auVar52._4_4_ * 4.7683716e-07;
        auVar88._8_4_ = auVar53._8_4_ + auVar52._8_4_ * 4.7683716e-07;
        auVar88._12_4_ = auVar53._12_4_ + auVar52._12_4_ * 4.7683716e-07;
        uVar7 = vextractps_avx(auVar78,2);
        *(undefined4 *)(uVar44 + 0x60 + uVar47 * 4) = uVar7;
        *(float *)(uVar44 + 0x30 + uVar47 * 4) = auVar92._0_4_;
        uVar7 = vextractps_avx(auVar92,1);
        *(undefined4 *)(uVar44 + 0x50 + uVar47 * 4) = uVar7;
        auVar52 = vsubps_avx(auVar54,auVar78);
        uVar7 = vextractps_avx(auVar92,2);
        *(undefined4 *)(uVar44 + 0x70 + uVar47 * 4) = uVar7;
        *(int *)(uVar44 + 0x80 + uVar47 * 4) = auVar52._0_4_;
        uVar7 = vextractps_avx(auVar52,1);
        *(undefined4 *)(uVar44 + 0xa0 + uVar47 * 4) = uVar7;
        auVar54 = vsubps_avx(auVar88,auVar92);
        uVar7 = vextractps_avx(auVar52,2);
        *(undefined4 *)(uVar44 + 0xc0 + uVar47 * 4) = uVar7;
        *(int *)(uVar44 + 0x90 + uVar47 * 4) = auVar54._0_4_;
        uVar7 = vextractps_avx(auVar54,1);
        *(undefined4 *)(uVar44 + 0xb0 + uVar47 * 4) = uVar7;
        uVar7 = vextractps_avx(auVar54,2);
        *(undefined4 *)(uVar44 + 0xd0 + uVar47 * 4) = uVar7;
        *(float *)(uVar44 + 0xe0 + uVar47 * 4) = fVar71;
        auVar52 = vcmpss_avx(ZEXT416((uint)fVar65),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar52 = vblendvps_avx(ZEXT416((uint)fVar65),auVar82,auVar52);
        *(int *)(uVar44 + 0xf0 + uVar47 * 4) = auVar52._0_4_;
        uVar47 = uVar47 + 1;
        pfVar38 = pfVar38 + 0x18;
      } while (local_848 != uVar47);
    }
    uVar47 = (ulong)(uint)local_1db8;
    fVar65 = (float)local_1de8._0_4_;
    fVar71 = (float)local_1de8._4_4_;
    fVar79 = fStack_1de0;
    fVar85 = fStack_1ddc;
  }
  uVar28 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar27 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar47 == '\0') {
    (__return_storage_ptr__->ref).ptr = uVar48 | (ulong)pcVar41;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1dc8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e08._8_8_;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0.m128[0] = fVar65;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0.m128[1] = fVar71;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0.m128[2] = fVar79;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0.m128[3] = fVar85;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e18;
  }
  else {
    vSplitPos.field_0.v[1] = local_1df8._0_8_ + 0x58;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    aVar56.m128[2] = INFINITY;
    aVar56._0_8_ = 0x7f8000007f800000;
    aVar56.m128[3] = INFINITY;
    aVar63.m128[2] = -INFINITY;
    aVar63._0_8_ = 0xff800000ff800000;
    aVar63.m128[3] = -INFINITY;
    uVar47 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
             current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
    local_1ab8 = aVar56;
    local_1aa8 = aVar63;
    aStack_1a98 = aVar56;
    local_1a88 = aVar63;
    local_1db8 = puVar34;
    if (uVar47 < 0xc00) {
      aVar69 = aVar63;
      aVar57 = aVar56;
      if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin <
          current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
        lVar36 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0xc;
        aVar69.m128[2] = -INFINITY;
        aVar69._0_8_ = 0xff800000ff800000;
        aVar69.m128[3] = -INFINITY;
        aVar74.m128[2] = INFINITY;
        aVar74._0_8_ = 0x7f8000007f800000;
        aVar74.m128[3] = INFINITY;
        aVar63 = aVar69;
        aVar57 = aVar74;
        do {
          local_1df8 = aVar57;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
          pIVar12 = *(Instance **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->
                                             lbounds).bounds0.lower.field_0 + lVar36) * 8);
          local_1e18 = aVar74;
          local_1e08 = aVar69;
          local_1dc8 = aVar63;
          Instance::nonlinearBounds
                    (&lbbox_1,pIVar12,(BBox1f *)&right,&(pIVar12->super_Geometry).time_range,
                     (pIVar12->super_Geometry).fnumTimeSegments);
          auVar16._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar16._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar16._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar16._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar56.m128 = (__m128)vminps_avx(local_1e18.m128,auVar16);
          auVar18._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar18._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar63.m128 = (__m128)vmaxps_avx(local_1dc8.m128,auVar18);
          auVar20._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar20._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar57.m128 = (__m128)vminps_avx(local_1df8.m128,auVar20);
          auVar22._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar22._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar69.m128 = (__m128)vmaxps_avx(local_1e08.m128,auVar22);
          lVar36 = lVar36 + 0x50;
          uVar47 = uVar47 - 1;
          aVar74 = aVar56;
        } while (uVar47 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar28;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar27;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1ab8.field_1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,in_stack_ffffffffffffe1d8);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar30 != '\0') {
        prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar35,"task cancelled");
        __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar56.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
           [1];
      aVar56.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
           [0];
      aVar56.m128[2] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
           [2];
      aVar56.m128[3] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
           [3];
      aVar63.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
           [1];
      aVar63.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
           [0];
      aVar63.m128[2] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
           [2];
      aVar63.m128[3] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
           [3];
      aVar57.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
           [1];
      aVar57.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
           [0];
      aVar57.m128[2] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
           [2];
      aVar57.m128[3] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
           [3];
      aVar69.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
           [1];
      aVar69.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
           [0];
      aVar69.m128[2] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
           [2];
      aVar69.m128[3] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
           [3];
    }
    (__return_storage_ptr__->ref).ptr = uVar48 | (ulong)pcVar41;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar56;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar63;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar57;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar69;
    puVar34 = local_1db8;
  }
  __return_storage_ptr__->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar47 = 0;
  do {
    ppmVar13 = local_8c8[uVar47];
    ppmVar9 = ppmVar13 + 1;
    *ppmVar9 = (PrimRefVector)((long)&(*ppmVar9)[-1].items + 7);
    if (*ppmVar9 == (PrimRefVector)0x0) {
      pmVar37 = *ppmVar13;
      if (pmVar37 != (PrimRefVector)0x0) {
        sVar33 = pmVar37->size_alloced;
        pPVar32 = pmVar37->items;
        local_1db8 = puVar34;
        if (pPVar32 != (PrimRefMB *)0x0) {
          if (sVar33 * 0x50 < 0x1c00000) {
            alignedFree(pPVar32);
          }
          else {
            os_free(pPVar32,sVar33 * 0x50,(pmVar37->alloc).hugepages);
          }
        }
        puVar34 = local_1db8;
        if (sVar33 != 0) {
          pMVar14 = (pmVar37->alloc).device;
          (**pMVar14->_vptr_MemoryMonitorInterface)(pMVar14,sVar33 * -0x50,1);
          puVar34 = local_1db8;
        }
        pmVar37->size_active = SUB168(ZEXT816(0) << 0x40,0);
        pmVar37->size_alloced = SUB168(ZEXT816(0) << 0x40,8);
        pmVar37->items = (PrimRefMB *)0x0;
      }
      local_1db8 = puVar34;
      operator_delete(pmVar37);
      puVar34 = local_1db8;
    }
    uVar47 = uVar47 + 1;
  } while (uVar47 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }